

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_slab.c
# Opt level: O0

void ngx_slab_init(ngx_slab_pool_t *pool)

{
  u_char *puVar1;
  ngx_slab_page_t *pnVar2;
  ngx_slab_pool_t *pnVar3;
  ulong uVar4;
  ngx_slab_stat_t *pnVar5;
  long lVar6;
  ngx_slab_page_t *page;
  ngx_slab_page_t *slots;
  ngx_uint_t pages;
  ngx_uint_t n;
  ngx_uint_t i;
  ngx_int_t m;
  size_t size;
  u_char *p;
  ngx_slab_pool_t *pool_local;
  
  if (ngx_slab_max_size == 0) {
    ngx_slab_max_size = ngx_pagesize >> 1;
    ngx_slab_exact_size = ngx_pagesize >> 6;
    pages = ngx_slab_exact_size;
    while (pages = pages >> 1, pages != 0) {
      ngx_slab_exact_shift = ngx_slab_exact_shift + 1;
    }
  }
  pool->min_size = 1L << ((byte)pool->min_shift & 0x3f);
  pnVar3 = pool + 1;
  puVar1 = pool->end;
  uVar4 = ngx_pagesize_shift - pool->min_shift;
  for (n = 0; n < uVar4; n = n + 1) {
    (&pnVar3->lock)[n * 3].lock = 0;
    (&pnVar3->min_size)[n * 3] = (size_t)(&pnVar3->lock + n * 3);
    (&pnVar3->min_shift)[n * 3] = 0;
  }
  pnVar5 = (ngx_slab_stat_t *)(uVar4 * 0x18 + (long)pnVar3);
  pool->stats = pnVar5;
  memset(pool->stats,0,uVar4 * 0x20);
  pnVar5 = pnVar5 + uVar4;
  slots = (ngx_slab_page_t *)
          ((ulong)(puVar1 + (uVar4 * -0x38 - (long)pnVar3)) / (ngx_pagesize + 0x18));
  pool->pages = (ngx_slab_page_t *)pnVar5;
  memset(pool->pages,0,(long)slots * 0x18);
  pnVar2 = pool->pages;
  (pool->free).slab = 0;
  (pool->free).next = pnVar2;
  (pool->free).prev = 0;
  pnVar2->slab = (uintptr_t)slots;
  pnVar2->next = &pool->free;
  pnVar2->prev = (uintptr_t)&pool->free;
  pool->start = (u_char *)
                ((long)pnVar5 + (ngx_pagesize - 1) + (long)slots * 0x18 &
                (ngx_pagesize - 1 ^ 0xffffffffffffffff));
  lVar6 = (long)slots - (ulong)((long)pool->end - (long)pool->start) / ngx_pagesize;
  if (0 < lVar6) {
    slots = (ngx_slab_page_t *)((long)slots - lVar6);
    pnVar2->slab = (uintptr_t)slots;
  }
  pool->last = pool->pages + (long)slots;
  pool->pfree = (ngx_uint_t)slots;
  pool->field_0x79 = pool->field_0x79 & 0xfe | 1;
  pool->log_ctx = &pool->zero;
  pool->zero = '\0';
  return;
}

Assistant:

void
ngx_slab_init(ngx_slab_pool_t *pool)
{
    u_char           *p;
    size_t            size;
    ngx_int_t         m;
    ngx_uint_t        i, n, pages;
    ngx_slab_page_t  *slots, *page;

    /* STUB */
    if (ngx_slab_max_size == 0) {
        ngx_slab_max_size = ngx_pagesize / 2;
        ngx_slab_exact_size = ngx_pagesize / (8 * sizeof(uintptr_t));
        for (n = ngx_slab_exact_size; n >>= 1; ngx_slab_exact_shift++) {
            /* void */
        }
    }
    /**/

    pool->min_size = (size_t) 1 << pool->min_shift;

    slots = ngx_slab_slots(pool);

    p = (u_char *) slots;
    size = pool->end - p;

    ngx_slab_junk(p, size);

    n = ngx_pagesize_shift - pool->min_shift;

    for (i = 0; i < n; i++) {
        /* only "next" is used in list head */
        slots[i].slab = 0;
        slots[i].next = &slots[i];
        slots[i].prev = 0;
    }

    p += n * sizeof(ngx_slab_page_t);

    pool->stats = (ngx_slab_stat_t *) p;
    ngx_memzero(pool->stats, n * sizeof(ngx_slab_stat_t));

    p += n * sizeof(ngx_slab_stat_t);

    size -= n * (sizeof(ngx_slab_page_t) + sizeof(ngx_slab_stat_t));

    pages = (ngx_uint_t) (size / (ngx_pagesize + sizeof(ngx_slab_page_t)));

    pool->pages = (ngx_slab_page_t *) p;
    ngx_memzero(pool->pages, pages * sizeof(ngx_slab_page_t));

    page = pool->pages;

    /* only "next" is used in list head */
    pool->free.slab = 0;
    pool->free.next = page;
    pool->free.prev = 0;

    page->slab = pages;
    page->next = &pool->free;
    page->prev = (uintptr_t) &pool->free;

    pool->start = ngx_align_ptr(p + pages * sizeof(ngx_slab_page_t),
                                ngx_pagesize);

    m = pages - (pool->end - pool->start) / ngx_pagesize;
    if (m > 0) {
        pages -= m;
        page->slab = pages;
    }

    pool->last = pool->pages + pages;
    pool->pfree = pages;

    pool->log_nomem = 1;
    pool->log_ctx = &pool->zero;
    pool->zero = '\0';
}